

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O1

bool instIsCallOf(Instruction *I,string *name,LLVMPointerAnalysis *pta)

{
  size_t sVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  LLVMPointsToSetImpl *pLVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  const_iterator __begin1;
  LLVMPointsToSet pts;
  const_iterator __end1;
  const_iterator local_68;
  undefined1 *local_60;
  size_t local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  LLVMPointsToSetImpl *local_40;
  const_iterator local_38;
  
  bVar8 = false;
  if (I[0x10] == (Instruction)0x53) {
    lVar6 = *(long *)(I + -0x20);
    lVar4 = 0;
    if ((lVar6 != 0) && (*(char *)(lVar6 + 0x10) == '\0')) {
      lVar4 = lVar6;
    }
    if ((lVar4 == 0) || (*(long *)(lVar4 + 0x18) != *(long *)(I + 0x48))) {
      lVar4 = 0;
    }
    if (lVar4 == 0) {
      uVar5 = llvm::Value::stripPointerCasts();
      if (pta == (LLVMPointerAnalysis *)0x0) {
        bVar8 = funHasAddrTaken(*(Module **)(*(long *)(*(long *)(I + 0x28) + 0x38) + 0x28),name);
        return bVar8;
      }
      (**(code **)(*(long *)pta + 8))(&local_40,pta,uVar5);
      lVar6 = (**(code **)(*(long *)local_40 + 0x20))();
      pLVar7 = local_40;
      if (lVar6 == 0) {
        bVar8 = funHasAddrTaken(*(Module **)(*(long *)(*(long *)(I + 0x28) + 0x38) + 0x28),name);
      }
      else {
        if ((local_40 != (LLVMPointsToSetImpl *)0x0) &&
           (cVar2 = (**(code **)(*(long *)local_40 + 0x38))(local_40), cVar2 != '\0')) {
          pLVar7 = (LLVMPointsToSetImpl *)0x0;
        }
        local_38.impl = (LLVMPointsToSetImpl *)0x0;
        local_68.impl = pLVar7;
        bVar8 = dg::LLVMPointsToSet::const_iterator::operator==(&local_68,&local_38);
        if (!bVar8) {
          do {
            lVar6 = (**(code **)(*(long *)local_68.impl + 0x48))();
            cVar2 = '\x03';
            if (lVar6 != 0 && *(char *)(lVar6 + 0x10) == '\0') {
              auVar9 = llvm::Value::getName();
              lVar6 = auVar9._0_8_;
              local_60 = &local_50;
              if (lVar6 == 0) {
                local_58 = 0;
                local_50 = 0;
              }
              else {
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_60,lVar6,auVar9._8_8_ + lVar6);
              }
              sVar1 = name->_M_string_length;
              cVar2 = false;
              if (sVar1 == local_58) {
                if (sVar1 == 0) {
                  cVar2 = true;
                }
                else {
                  iVar3 = bcmp((name->_M_dataplus)._M_p,local_60,sVar1);
                  cVar2 = iVar3 == 0;
                }
              }
              if (local_60 != &local_50) {
                operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
              }
            }
            if ((cVar2 != '\x03') && (cVar2 != '\0')) break;
            (**(code **)(*(long *)local_68.impl + 0x40))();
            cVar2 = (**(code **)(*(long *)local_68.impl + 0x38))();
            if (cVar2 != '\0') {
              local_68.impl = (LLVMPointsToSetImpl *)0x0;
            }
            bVar8 = dg::LLVMPointsToSet::const_iterator::operator==(&local_68,&local_38);
          } while (!bVar8);
        }
        bVar8 = (bool)(bVar8 ^ 1);
      }
      if (local_40 != (LLVMPointsToSetImpl *)0x0) {
        (**(code **)(*(long *)local_40 + 0x58))();
      }
    }
    else {
      auVar9 = llvm::Value::getName();
      lVar6 = auVar9._0_8_;
      if (lVar6 == 0) {
        local_60 = &local_50;
        local_58 = 0;
        local_50 = 0;
      }
      else {
        local_60 = &local_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,lVar6,auVar9._8_8_ + lVar6);
      }
      sVar1 = name->_M_string_length;
      if (sVar1 == local_58) {
        if (sVar1 == 0) {
          bVar8 = true;
        }
        else {
          iVar3 = bcmp((name->_M_dataplus)._M_p,local_60,sVar1);
          bVar8 = iVar3 == 0;
        }
      }
      else {
        bVar8 = false;
      }
      if (local_60 != &local_50) {
        operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
      }
    }
  }
  return bVar8;
}

Assistant:

static bool instIsCallOf(const llvm::Instruction &I, const std::string &name,
                         LLVMPointerAnalysis *pta = nullptr) {
    const auto *C = llvm::dyn_cast<llvm::CallInst>(&I);
    if (!C)
        return false;

    auto *fun = C->getCalledFunction();
    if (fun) {
        return name == fun->getName().str();
    }

#if LLVM_VERSION_MAJOR >= 8
    auto *V = C->getCalledOperand()->stripPointerCasts();
#else
    auto *V = C->getCalledValue()->stripPointerCasts();
#endif

    if (!pta) {
        auto *M = I.getParent()->getParent()->getParent();
        return funHasAddrTaken(M, name);
    }

    auto pts = pta->getLLVMPointsTo(V);
    if (pts.empty()) {
        auto *M = I.getParent()->getParent()->getParent();
        return funHasAddrTaken(M, name);
    }

    for (const auto &ptr : pts) {
        fun = llvm::dyn_cast<llvm::Function>(ptr.value);
        if (!fun)
            continue;
        if (name == fun->getName().str())
            return true;
    }

    return false;
}